

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  int64_t iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Args *this;
  Args *in_RDI;
  Autotune autotune;
  ofstream ofs;
  AutotuneCallback *in_stack_00000390;
  Args *in_stack_00000398;
  Autotune *in_stack_000003a0;
  string outputFileName;
  shared_ptr<fasttext::FastText> fasttext;
  Args a;
  Autotune *in_stack_fffffffffffffa80;
  FastText *in_stack_fffffffffffffa88;
  Autotune *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  string local_528 [32];
  string local_508 [199];
  undefined1 local_441;
  string local_440 [32];
  undefined1 local_420 [24];
  Args *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffcc8;
  FastText *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffd48;
  FastText *in_stack_fffffffffffffd50;
  TrainCallback *in_stack_fffffffffffffd70;
  Args *in_stack_fffffffffffffd78;
  FastText *in_stack_fffffffffffffd80;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  Args *in_stack_fffffffffffffe40;
  byte local_98;
  
  ::fasttext::Args::Args(in_RDI);
  ::fasttext::Args::parseArgs(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::make_shared<fasttext::FastText>();
  std::__cxx11::string::string(local_1e0);
  bVar1 = ::fasttext::Args::hasAutotune((Args *)0x1de2c0);
  if (bVar1) {
    iVar4 = ::fasttext::Args::getAutotuneModelSize(in_stack_fffffffffffffbf8);
    if (((double)iVar4 != -1.0) || (NAN((double)iVar4))) {
      std::operator+(in_stack_fffffffffffffaa8,
                     (char *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
      std::__cxx11::string::operator=(local_1e0,local_200);
      std::__cxx11::string::~string(local_200);
      goto LAB_001de3b7;
    }
  }
  std::operator+(in_stack_fffffffffffffaa8,
                 (char *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
  std::__cxx11::string::operator=(local_1e0,local_220);
  std::__cxx11::string::~string(local_220);
LAB_001de3b7:
  std::ofstream::ofstream(local_420,local_1e0,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ofstream::close();
    uVar3 = ::fasttext::Args::hasAutotune((Args *)0x1de4e9);
    if ((bool)uVar3) {
      std::__shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xfffffffffffffe40);
      ::fasttext::Autotune::Autotune(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::function<void_(double,_int,_double,_double)>::function
                ((function<void_(double,_int,_double,_double)> *)in_stack_fffffffffffffa80);
      ::fasttext::Autotune::train(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
      std::function<void_(double,_int,_double,_double)>::~function
                ((function<void_(double,_int,_double,_double)> *)0x1de556);
      ::fasttext::Autotune::~Autotune(in_stack_fffffffffffffa80);
    }
    else {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1de5a8);
      std::function<void_(float,_float,_double,_double,_long)>::function
                ((function<void_(float,_float,_double,_double,_long)> *)in_stack_fffffffffffffa80);
      ::fasttext::FastText::train
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      std::function<void_(float,_float,_double,_double,_long)>::~function
                ((function<void_(float,_float,_double,_double,_long)> *)0x1de5e5);
    }
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1de61a);
    ::fasttext::FastText::saveModel(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    this = (Args *)std::
                   __shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1de639);
    std::operator+(in_stack_fffffffffffffaa8,(char *)CONCAT17(uVar3,in_stack_fffffffffffffaa0));
    ::fasttext::FastText::saveVectors(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::__cxx11::string::~string(local_508);
    if ((local_98 & 1) != 0) {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1de698);
      std::operator+(in_stack_fffffffffffffaa8,(char *)CONCAT17(uVar3,in_stack_fffffffffffffaa0));
      ::fasttext::FastText::saveOutput(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      std::__cxx11::string::~string(local_528);
    }
    std::ofstream::~ofstream(local_420);
    std::__cxx11::string::~string(local_1e0);
    std::shared_ptr<fasttext::FastText>::~shared_ptr((shared_ptr<fasttext::FastText> *)0x1de73d);
    ::fasttext::Args::~Args(this);
    return;
  }
  local_441 = 1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
  std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_440);
  local_441 = 0;
  __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext.get());
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}